

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromCpuInfoFile
          (string *__return_storage_ptr__,SystemInformationImplementation *this,string *buffer,
          char *word,size_t init)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  size_t init_00;
  size_t sVar4;
  ulong uVar5;
  string local_50;
  
  strlen(word);
  uVar3 = std::__cxx11::string::find((char *)buffer,(ulong)word,init);
  if (uVar3 != 0xffffffffffffffff) {
    this->CurrentPositionInFile = uVar3;
    uVar3 = std::__cxx11::string::find((char *)buffer,0x52e3a8,uVar3);
    init_00 = std::__cxx11::string::find((char *)buffer,0x54ad89,uVar3);
    if (init_00 != 0xffffffffffffffff && uVar3 != 0xffffffffffffffff) {
      sVar1 = this->CurrentPositionInFile;
      sVar4 = strlen(word);
      uVar5 = sVar4 + sVar1;
      if (uVar5 < uVar3) {
        pcVar2 = (buffer->_M_dataplus)._M_p;
        do {
          if ((pcVar2[uVar5] != '\t') && (pcVar2[uVar5] != ' ')) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar2,pcVar2 + buffer->_M_string_length);
            ExtractValueFromCpuInfoFile(__return_storage_ptr__,this,&local_50,word,init_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar3);
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)buffer);
      return __return_storage_ptr__;
    }
  }
  this->CurrentPositionInFile = 0xffffffffffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromCpuInfoFile(std::string buffer,const char* word,size_t init)
{
  size_t pos = buffer.find(word,init);
  if(pos != buffer.npos)
    {
    this->CurrentPositionInFile = pos;
    pos = buffer.find(":",pos);
    size_t pos2 = buffer.find("\n",pos);
    if(pos!=buffer.npos && pos2!=buffer.npos)
      {
      // It may happen that the beginning matches, but this is still not the requested key.
      // An example is looking for "cpu" when "cpu family" comes first. So we check that
      // we have only spaces from here to pos, otherwise we search again.
      for(size_t i=this->CurrentPositionInFile+strlen(word); i < pos; ++i)
        {
        if(buffer[i] != ' ' && buffer[i] != '\t')
          {
          return this->ExtractValueFromCpuInfoFile(buffer, word, pos2);
          }
        }
      return buffer.substr(pos+2,pos2-pos-2);
      }
    }
  this->CurrentPositionInFile = buffer.npos;
  return "";
}